

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.c
# Opt level: O3

PyObject * libxml_xmlCharPtrConstWrap(xmlChar *str)

{
  PyObject *pPVar1;
  
  if (str == (xmlChar *)0x0) {
    __Py_NoneStruct = __Py_NoneStruct + 1;
    return (PyObject *)&_Py_NoneStruct;
  }
  pPVar1 = (PyObject *)PyUnicode_FromString();
  return pPVar1;
}

Assistant:

PyObject *
libxml_xmlCharPtrConstWrap(const xmlChar * str)
{
    PyObject *ret;

#ifdef DEBUG
    printf("libxml_xmlCharPtrWrap: str = %s\n", str);
#endif
    if (str == NULL) {
        Py_INCREF(Py_None);
        return (Py_None);
    }
    ret = PY_IMPORT_STRING((char *) str);
    return (ret);
}